

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O3

void __thiscall CaDiCaL::LratChecker::enlarge_vars(LratChecker *this,int64_t idx)

{
  size_type __new_size;
  size_type sVar1;
  
  __new_size = 2;
  if (this->size_vars != 0) {
    __new_size = this->size_vars * 2;
  }
  do {
    sVar1 = __new_size;
    __new_size = sVar1 * 2;
  } while ((long)sVar1 <= idx);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->marks,__new_size);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->checked_lits,__new_size);
  this->size_vars = sVar1;
  return;
}

Assistant:

void LratChecker::enlarge_vars (int64_t idx) {

  assert (0 < idx), assert (idx <= INT_MAX);

  int64_t new_size_vars = size_vars ? 2 * size_vars : 2;
  while (idx >= new_size_vars)
    new_size_vars *= 2;
  LOG ("LRAT CHECKER enlarging variables of checker from %" PRId64
       " to %" PRId64 "",
       size_vars, new_size_vars);

  marks.resize (2 * new_size_vars);
  checked_lits.resize (2 * new_size_vars);

  assert (idx < new_size_vars);
  size_vars = new_size_vars;
}